

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::(anonymous_namespace)::formatDuration_abi_cxx11_(double seconds)

{
  _Setprecision _Var1;
  ReusableStringStream *this;
  string *in_RDI;
  ReusableStringStream rss;
  _func_ios_base_ptr_ios_base_ptr *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  string *this_00;
  ReusableStringStream *in_stack_ffffffffffffffd0;
  ReusableStringStream *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffd0);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  _Var1 = clara::std::setprecision(3);
  this = ReusableStringStream::operator<<((ReusableStringStream *)this_00,(_Setprecision *)in_RDI);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)CONCAT44(_Var1._M_n,in_stack_ffffffffffffffa0),(double *)this);
  ReusableStringStream::str_abi_cxx11_(this);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffe0);
  return this_00;
}

Assistant:

std::string formatDuration( double seconds ) {
            ReusableStringStream rss;
            rss << std::fixed << std::setprecision( 3 ) << seconds;
            return rss.str();
        }